

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O3

void __thiscall Assimp::IrrlichtBase::ReadHexProperty(IrrlichtBase *this,HexProperty *out)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar3;
  undefined4 extraout_var_02;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  allocator local_51;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar2 = (*this->reader->_vptr_IIrrXMLReader[4])();
  if (iVar2 < 1) {
    return;
  }
  uVar6 = 0;
LAB_0040f542:
  iVar2 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar6);
  if ((char *)CONCAT44(extraout_var,iVar2) == (char *)0x0) {
LAB_0040f63a:
    __assert_fail("__null != s1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                  ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
  }
  iVar2 = strcasecmp((char *)CONCAT44(extraout_var,iVar2),"name");
  if (iVar2 == 0) {
    iVar2 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar6);
    std::__cxx11::string::string
              ((string *)local_50,(char *)CONCAT44(extraout_var_02,iVar2),&local_51);
    std::__cxx11::string::operator=((string *)out,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  else {
    iVar2 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar6);
    if ((char *)CONCAT44(extraout_var_00,iVar2) == (char *)0x0) goto LAB_0040f63a;
    iVar2 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar2),"value");
    if (iVar2 == 0) {
      iVar2 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar6);
      pcVar3 = (char *)CONCAT44(extraout_var_01,iVar2);
      uVar4 = 0;
      do {
        cVar1 = *pcVar3;
        if ((byte)(cVar1 - 0x30U) < 10) {
          uVar4 = uVar4 << 4 | (uint)(byte)(cVar1 - 0x30U);
        }
        else {
          bVar5 = cVar1 + 0xbf;
          if ((5 < bVar5) && (bVar5 = cVar1 + 0x9f, 5 < bVar5)) goto LAB_0040f615;
          uVar4 = uVar4 * 0x10 + (uint)bVar5 + 10;
        }
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
  }
  goto LAB_0040f618;
LAB_0040f615:
  out->value = uVar4;
LAB_0040f618:
  uVar6 = uVar6 + 1;
  iVar2 = (*this->reader->_vptr_IIrrXMLReader[4])();
  if (iVar2 <= (int)uVar6) {
    return;
  }
  goto LAB_0040f542;
}

Assistant:

void IrrlichtBase::ReadHexProperty    (HexProperty&    out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // parse the hexadecimal value
            out.value = strtoul16(reader->getAttributeValue(i));
        }
    }
}